

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scale_gcc.cc
# Opt level: O1

void ScaleRowDown2_AVX2(uint8_t *src_ptr,ptrdiff_t src_stride,uint8_t *dst_ptr,int dst_width)

{
  undefined1 (*pauVar1) [32];
  bool bVar2;
  int iVar3;
  undefined1 auVar4 [32];
  undefined1 auVar5 [32];
  
  do {
    auVar4 = *(undefined1 (*) [32])src_ptr;
    pauVar1 = (undefined1 (*) [32])((long)src_ptr + 0x20);
    src_ptr = (uint8_t *)((long)src_ptr + 0x40);
    auVar4 = vpsrlw_avx2(auVar4,8);
    auVar5 = vpsrlw_avx2(*pauVar1,8);
    auVar4 = vpackuswb_avx2(auVar4,auVar5);
    auVar4 = vpermq_avx2(auVar4,0xd8);
    *(undefined1 (*) [32])dst_ptr = auVar4;
    dst_ptr = (uint8_t *)((long)dst_ptr + 0x20);
    iVar3 = dst_width + -0x20;
    bVar2 = 0x1f < dst_width;
    dst_width = iVar3;
  } while (iVar3 != 0 && bVar2);
  return;
}

Assistant:

void ScaleRowDown2_AVX2(const uint8_t* src_ptr,
                        ptrdiff_t src_stride,
                        uint8_t* dst_ptr,
                        int dst_width) {
  (void)src_stride;
  asm volatile(

      LABELALIGN
      "1:                                        \n"
      "vmovdqu     (%0),%%ymm0                   \n"
      "vmovdqu     0x20(%0),%%ymm1               \n"
      "lea         0x40(%0),%0                   \n"
      "vpsrlw      $0x8,%%ymm0,%%ymm0            \n"
      "vpsrlw      $0x8,%%ymm1,%%ymm1            \n"
      "vpackuswb   %%ymm1,%%ymm0,%%ymm0          \n"
      "vpermq      $0xd8,%%ymm0,%%ymm0           \n"
      "vmovdqu     %%ymm0,(%1)                   \n"
      "lea         0x20(%1),%1                   \n"
      "sub         $0x20,%2                      \n"
      "jg          1b                            \n"
      "vzeroupper                                \n"
      : "+r"(src_ptr),   // %0
        "+r"(dst_ptr),   // %1
        "+r"(dst_width)  // %2
        ::"memory",
        "cc", "xmm0", "xmm1");
}